

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBAmrUtil.cpp
# Opt level: O1

void amrex::TagVolfrac(TagBoxArray *tags,MultiFab *volfrac,Real tol)

{
  int iVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  MFIter mfi;
  Box local_12c;
  Array4<const_double> local_110;
  Array4<char> local_d0;
  MFIter local_90;
  
  MFIter::MFIter(&local_90,(FabArrayBase *)volfrac,true);
  if (local_90.currentIndex < local_90.endIndex) {
    do {
      MFIter::tilebox(&local_12c,&local_90);
      FabArray<amrex::TagBox>::array<amrex::TagBox,_0>
                (&local_d0,&tags->super_FabArray<amrex::TagBox>,&local_90);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_110,&volfrac->super_FabArray<amrex::FArrayBox>,&local_90);
      if (local_12c.smallend.vect[2] <= local_12c.bigend.vect[2]) {
        iVar1 = local_12c.smallend.vect[2];
        do {
          iVar3 = local_12c.smallend.vect[1];
          if (local_12c.smallend.vect[1] <= local_12c.bigend.vect[1]) {
            do {
              iVar2 = local_12c.smallend.vect[0];
              if (local_12c.smallend.vect[0] <= local_12c.bigend.vect[0]) {
                do {
                  if ((local_110.p
                       [((long)iVar3 - (long)local_110.begin.y) * local_110.jstride +
                        (long)(iVar2 - local_110.begin.x) +
                        ((long)iVar1 - (long)local_110.begin.z) * local_110.kstride] <= 1.0 - tol)
                     && (tol <= local_110.p
                                [((long)iVar3 - (long)local_110.begin.y) * local_110.jstride +
                                 (long)(iVar2 - local_110.begin.x) +
                                 ((long)iVar1 - (long)local_110.begin.z) * local_110.kstride])) {
                    local_d0.p
                    [((long)iVar1 - (long)local_d0.begin.z) * local_d0.kstride +
                     (long)(iVar2 - local_d0.begin.x) +
                     ((long)iVar3 - (long)local_d0.begin.y) * local_d0.jstride] = '\x02';
                  }
                  iVar2 = iVar2 + 1;
                } while (local_12c.bigend.vect[0] + 1 != iVar2);
              }
              bVar4 = iVar3 != local_12c.bigend.vect[1];
              iVar3 = iVar3 + 1;
            } while (bVar4);
          }
          bVar4 = iVar1 != local_12c.bigend.vect[2];
          iVar1 = iVar1 + 1;
        } while (bVar4);
      }
      MFIter::operator++(&local_90);
    } while (local_90.currentIndex < local_90.endIndex);
  }
  MFIter::~MFIter(&local_90);
  return;
}

Assistant:

void
TagVolfrac (TagBoxArray& tags, const MultiFab& volfrac, Real tol)
{
    BL_PROFILE("amrex::TagVolfrac()");

//    const char clearval = TagBox::CLEAR;
    const char   tagval = TagBox::SET;

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(volfrac, TilingIfNotGPU()); mfi.isValid(); ++mfi) {
        const Box& bx = mfi.tilebox();
        Array4<char> const& tagarr = tags.array(mfi);
        Array4<Real const> const& volarr = volfrac.const_array(mfi);
        AMREX_HOST_DEVICE_FOR_3D ( bx, i, j, k,
        {
            if (volarr(i,j,k) <= (1.-tol) && volarr(i,j,k) >= tol) {
                tagarr(i,j,k) = tagval;
            }
        });
    }
}